

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_database_statement.cpp
# Opt level: O2

void __thiscall
duckdb::CopyDatabaseStatement::CopyDatabaseStatement
          (CopyDatabaseStatement *this,CopyDatabaseStatement *other)

{
  SQLStatement::SQLStatement(&this->super_SQLStatement,&other->super_SQLStatement);
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__CopyDatabaseStatement_027a89e8
  ;
  ::std::__cxx11::string::string((string *)&this->from_database,(string *)&other->from_database);
  ::std::__cxx11::string::string((string *)&this->to_database,(string *)&other->to_database);
  this->copy_type = other->copy_type;
  return;
}

Assistant:

CopyDatabaseStatement::CopyDatabaseStatement(const CopyDatabaseStatement &other)
    : SQLStatement(other), from_database(other.from_database), to_database(other.to_database),
      copy_type(other.copy_type) {
}